

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_with_multiple_asset_not_consider_fee_Test::TestBody
          (CoinSelection_SelectCoins_with_multiple_asset_not_consider_fee_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  string *asset;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  key_type *__k;
  mapped_type_conflict *pmVar9;
  char *in_R9;
  Amount AVar10;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> ret;
  Txid txid;
  TestElementsUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  CoinSelectionOption option;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  reference in_stack_fffffffffffff7f8;
  CoinSelectionOption *in_stack_fffffffffffff800;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff808;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffff810;
  char *in_stack_fffffffffffff818;
  undefined7 in_stack_fffffffffffff820;
  undefined1 in_stack_fffffffffffff827;
  key_type *in_stack_fffffffffffff838;
  undefined7 in_stack_fffffffffffff840;
  undefined1 in_stack_fffffffffffff847;
  string local_668;
  AssertHelper local_648;
  Message local_640;
  string local_638;
  byte local_611;
  AssertionResult local_610;
  string local_600;
  AssertHelper local_5e0;
  Message local_5d8;
  string local_5d0;
  AssertionResult local_5b0;
  string local_5a0;
  AssertHelper local_580;
  Message local_578;
  string local_570;
  AssertionResult local_550;
  AssertHelper local_540;
  Message local_538;
  undefined4 local_52c;
  size_type local_528;
  AssertionResult local_520;
  AssertHelper local_510;
  Message local_508;
  undefined4 local_4fc;
  int64_t local_4f8;
  AssertionResult local_4f0;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined4 local_4cc;
  string local_4c8;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  undefined4 local_484;
  string local_480;
  AssertionResult local_460;
  AssertHelper local_450;
  Message local_448;
  undefined4 local_43c;
  string local_438;
  AssertionResult local_418;
  AssertHelper local_408;
  Message local_400;
  undefined4 local_3f4;
  size_type local_3f0;
  AssertionResult local_3e8;
  AssertHelper local_3d8;
  Message local_3d0;
  undefined8 local_3c8;
  AssertionResult local_3c0;
  AssertHelper local_3b0;
  Message local_3a8;
  undefined8 local_3a0;
  AssertionResult local_398;
  AssertHelper local_388;
  Message local_380;
  undefined8 local_378;
  AssertionResult local_370;
  AssertHelper local_360;
  Message local_358;
  undefined8 local_350;
  AssertionResult local_348;
  AssertHelper local_338;
  Message local_330;
  undefined8 local_328;
  AssertionResult local_320;
  AssertHelper local_310;
  Message local_308;
  undefined8 local_300;
  AssertionResult local_2f8;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined4 local_2d4;
  size_type local_2d0;
  AssertionResult local_2c8;
  AssertHelper local_2b8;
  Message local_2b0 [7];
  void *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd99;
  string *output_descriptor;
  uint32_t in_stack_fffffffffffffdac;
  Txid *in_stack_fffffffffffffdb0;
  Utxo *in_stack_fffffffffffffdc0;
  Script *in_stack_fffffffffffffdc8;
  Txid local_230;
  reference local_210;
  TestElementsUtxoCoinVector *local_208;
  __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
  local_200;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *local_1f8;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_1f0 [4];
  char local_1d0 [104];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_168 [2];
  uint64_t local_138;
  undefined1 local_130;
  uint64_t local_128;
  uint8_t local_120;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_118 [2];
  CoinSelectionOption *in_stack_ffffffffffffff18;
  UtxoFilter *in_stack_ffffffffffffff20;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_ffffffffffffff28;
  AmountMap *in_stack_ffffffffffffff30;
  undefined8 in_stack_ffffffffffffff38;
  string local_b8 [8];
  Amount *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_ffffffffffffff68;
  AmountMap *in_stack_ffffffffffffff70;
  string local_88 [4];
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffff800,
             SUB81((ulong)in_stack_fffffffffffff7f8 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27800e);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_88,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                        in_stack_fffffffffffff838);
  *pmVar3 = 0x6e6f7c0;
  std::__cxx11::string::~string((string *)local_88);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_b8,&exp_dummy_asset_b);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                        in_stack_fffffffffffff838);
  *pmVar3 = 0x1255eee;
  std::__cxx11::string::~string(local_b8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
            ((string *)&stack0xffffffffffffff28,&exp_dummy_asset_c);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                        in_stack_fffffffffffff838);
  *pmVar3 = 0x5e78920;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27810e);
  cfd::core::Amount::Amount((Amount *)local_118);
  AVar10 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_138 = AVar10.amount_;
  local_130 = AVar10.ignore_check_;
  local_128 = local_138;
  local_120 = local_130;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x278181);
  GetElementsOption();
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x2781b7);
  std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::size
            (&kExtCoinSelectElementsTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)
             CONCAT17(in_stack_fffffffffffff827,in_stack_fffffffffffff820),
             (size_type)in_stack_fffffffffffff818);
  local_1f0[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffff7f8
                         );
  local_1f8 = &kExtCoinSelectElementsTestVector;
  local_200._M_current =
       (TestElementsUtxoCoinVector *)
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::begin
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff7f8);
  local_208 = (TestElementsUtxoCoinVector *)
              std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::
              end((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffff7f8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff800,
                            (__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffff7f8), bVar1) {
    local_210 = __gnu_cxx::
                __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                ::operator*(&local_200);
    cfd::core::Txid::Txid(&local_230);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid((Txid *)&stack0xfffffffffffffdb0,&local_210->txid);
      cfd::core::Txid::operator=(&local_230,(Txid *)&stack0xfffffffffffffdb0);
      cfd::core::Txid::~Txid((Txid *)0x2782b3);
    }
    AVar10 = cfd::core::Amount::CreateBySatoshiAmount(local_210->amount);
    asset = (string *)AVar10.amount_;
    uVar2 = AVar10.ignore_check_;
    output_descriptor = asset;
    in_stack_fffffffffffff7f8 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(local_1f0);
    in_stack_fffffffffffff800 = (CoinSelectionOption *)0x0;
    in_R9 = (char *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,output_descriptor,
               (Amount *)CONCAT71(in_stack_fffffffffffffd99,uVar2),asset,in_stack_fffffffffffffd88,
               in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_1f0);
    cfd::core::Txid::~Txid((Txid *)0x2784dc);
    __gnu_cxx::
    __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
    ::operator++(&local_200);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27850d);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffff810 = local_168;
      in_stack_fffffffffffff808 = local_118;
      in_stack_fffffffffffff800 =
           (CoinSelectionOption *)
           &local_118[0].super__Vector_base<cfd::Utxo,_std::allocator<cfd::Utxo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
      in_stack_fffffffffffff7f8 = (reference)&local_128;
      in_stack_fffffffffffff818 = (char *)0x0;
      in_R9 = local_1d0;
      cfd::CoinSelection::SelectCoins
                ((CoinSelection *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff50,(AmountMap *)in_stack_ffffffffffffff58,
                 (Amount *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff70);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff810);
    }
  }
  else {
    testing::Message::Message(local_2b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x56d,
               "Expected: ret = coin_select.SelectCoins( map_target_amount, utxos, exp_filter, option, tx_fee, &map_select_value, &fee, &map_searched_bnb) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2b8,local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x27869b);
  }
  local_2d0 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                        ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5));
  local_2d4 = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
             (unsigned_long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_2e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x278790);
    testing::internal::AssertHelper::AssertHelper
              (&local_2e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x56f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
    testing::internal::AssertHelper::~AssertHelper(&local_2e8);
    testing::Message::~Message((Message *)0x2787f3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27884b);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size
                    ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5));
  if (sVar6 == 6) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),0);
    local_300 = 0x3a3bd64;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f8);
    if (!bVar1) {
      testing::Message::Message(&local_308);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27891a);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x571,pcVar5);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x27897d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2789d2);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),1);
    local_328 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_320);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x278a8b);
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x572,pcVar5);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      testing::Message::~Message((Message *)0x278aee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x278b43);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),2);
    local_350 = 0xef2e78;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_348);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x278bfc);
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x573,pcVar5);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      testing::Message::~Message((Message *)0x278c5f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x278cb4);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),3);
    local_378 = 0x119ed3e;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_370);
    if (!bVar1) {
      testing::Message::Message(&local_380);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x278d6d);
      testing::internal::AssertHelper::AssertHelper
                (&local_388,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x574,pcVar5);
      testing::internal::AssertHelper::operator=(&local_388,&local_380);
      testing::internal::AssertHelper::~AssertHelper(&local_388);
      testing::Message::~Message((Message *)0x278dd0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x278e25);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),4);
    local_3a0 = 750000;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
    if (!bVar1) {
      testing::Message::Message(&local_3a8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x278ede);
      testing::internal::AssertHelper::AssertHelper
                (&local_3b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x575,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3b0,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper(&local_3b0);
      testing::Message::~Message((Message *)0x278f41);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x278f96);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[]
              ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)(local_2b0 + 5),5);
    local_3c8 = 0x79252f0;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (unsigned_long *)in_stack_fffffffffffff808,(long *)in_stack_fffffffffffff800);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3c0);
    if (!bVar1) {
      testing::Message::Message(&local_3d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27904f);
      testing::internal::AssertHelper::AssertHelper
                (&local_3d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x576,pcVar5);
      testing::internal::AssertHelper::operator=(&local_3d8,&local_3d0);
      testing::internal::AssertHelper::~AssertHelper(&local_3d8);
      testing::Message::~Message((Message *)0x2790b2);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x279107);
  }
  local_3f0 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x279128);
  local_3f4 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
             (unsigned_long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3e8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2791c5);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x578,pcVar5);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message((Message *)0x279228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x279280);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x27928d);
  if (sVar7 == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_438,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838);
    local_43c = 0x6e6f7c0;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string((string *)&local_438);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_418);
    if (!bVar1) {
      testing::Message::Message(&local_448);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2793a6);
      testing::internal::AssertHelper::AssertHelper
                (&local_450,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x57a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_450,&local_448);
      testing::internal::AssertHelper::~AssertHelper(&local_450);
      testing::Message::~Message((Message *)0x279409);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x279461);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_480,&exp_dummy_asset_b);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838);
    local_484 = 0x1255eee;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string((string *)&local_480);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_460);
    if (!bVar1) {
      testing::Message::Message(&local_490);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x279570);
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x57b,pcVar5);
      testing::internal::AssertHelper::operator=(&local_498,&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      testing::Message::~Message((Message *)0x2795d3);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27962b);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_4c8,&exp_dummy_asset_c);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838);
    local_4cc = 0x79252f0;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
               (long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
    std::__cxx11::string::~string((string *)&local_4c8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar1) {
      testing::Message::Message(&local_4d8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27973a);
      testing::internal::AssertHelper::AssertHelper
                (&local_4e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x57c,pcVar5);
      testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
      testing::internal::AssertHelper::~AssertHelper(&local_4e0);
      testing::Message::~Message((Message *)0x27979d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2797f2);
  }
  local_4f8 = cfd::core::Amount::GetSatoshiValue((Amount *)local_118);
  local_4fc = 0;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
             (long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4f0);
  if (!bVar1) {
    testing::Message::Message(&local_508);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x2798b6);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x57e,pcVar5);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message((Message *)0x279913);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x279968);
  local_528 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x279975);
  local_52c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffff818,(char *)in_stack_fffffffffffff810,
             (unsigned_long *)in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_520);
  if (!bVar1) {
    testing::Message::Message(&local_538);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x279a1e);
    testing::internal::AssertHelper::AssertHelper
              (&local_540,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x57f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_540,&local_538);
    testing::internal::AssertHelper::~AssertHelper(&local_540);
    testing::Message::~Message((Message *)0x279a7b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x279ad3);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x279ae0);
  if (sVar8 == 3) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_570,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)CONCAT17(in_stack_fffffffffffff847,in_stack_fffffffffffff840),
                 in_stack_fffffffffffff838);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff800,(bool *)in_stack_fffffffffffff7f8,
               (type *)0x279b32);
    std::__cxx11::string::~string((string *)&local_570);
    uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_550);
    if (!(bool)uVar2) {
      testing::Message::Message(&local_578);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_5a0,(internal *)&local_550,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_580,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x581,pcVar5);
      testing::internal::AssertHelper::operator=(&local_580,&local_578);
      testing::internal::AssertHelper::~AssertHelper(&local_580);
      std::__cxx11::string::~string((string *)&local_5a0);
      testing::Message::~Message((Message *)0x279c5d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x279cd8);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_5d0,&exp_dummy_asset_b);
    __k = (key_type *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                        *)CONCAT17(uVar2,in_stack_fffffffffffff840),in_stack_fffffffffffff838);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff800,(bool *)in_stack_fffffffffffff7f8,
               (type *)0x279d20);
    std::__cxx11::string::~string((string *)&local_5d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5b0);
    if (!bVar1) {
      testing::Message::Message(&local_5d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_600,(internal *)&local_5b0,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_b.GetHex()]","false","true",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_5e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x582,pcVar5);
      testing::internal::AssertHelper::operator=(&local_5e0,&local_5d8);
      testing::internal::AssertHelper::~AssertHelper(&local_5e0);
      std::__cxx11::string::~string((string *)&local_600);
      testing::Message::~Message((Message *)0x279e4b);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x279ec6);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_638,&exp_dummy_asset_c);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)CONCAT17(uVar2,in_stack_fffffffffffff840),__k);
    local_611 = ~*pmVar9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffff800,(bool *)in_stack_fffffffffffff7f8,
               (type *)0x279f23);
    std::__cxx11::string::~string((string *)&local_638);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_610);
    if (!bVar1) {
      testing::Message::Message(&local_640);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_668,(internal *)&local_610,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_c.GetHex()]","true","false",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_648,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x583,pcVar5);
      testing::internal::AssertHelper::operator=(&local_648,&local_640);
      testing::internal::AssertHelper::~AssertHelper(&local_648);
      std::__cxx11::string::~string((string *)&local_668);
      testing::Message::~Message((Message *)0x27a04e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27a0c6);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff810);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffff810);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27a0fe);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27a10b);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27a118);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27a125);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x27a132);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_with_multiple_asset_not_consider_fee)
{
  CoinSelection coin_select(true);
  // Same condition with "SelectCoins_SelectCoinsBnB"
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 115800000;
  map_target_amount[exp_dummy_asset_b.GetHex()] = 19226350;
  map_target_amount[exp_dummy_asset_c.GetHex()] = 99060000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;
  CoinSelectionOption option = GetElementsOption();
  option.SetEffectiveFeeBaserate(0);
  // not set fee asset

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset, nullptr,
        &(*ite));
    ++ite;
  }

  std::vector<Utxo> ret;
  EXPECT_NO_THROW(ret = coin_select.SelectCoins(
      map_target_amount, utxos, exp_filter, option,
      tx_fee, &map_select_value, &fee, &map_searched_bnb));

  EXPECT_EQ(ret.size(), 6);
  if (ret.size() == 6) {
    EXPECT_EQ(ret[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(ret[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(ret[2].amount, static_cast<int64_t>(15675000));
    EXPECT_EQ(ret[3].amount, static_cast<int64_t>(18476350));
    EXPECT_EQ(ret[4].amount, static_cast<int64_t>(750000));
    EXPECT_EQ(ret[5].amount, static_cast<int64_t>(127030000));
  }
  EXPECT_EQ(map_select_value.size(), 3);
  if (map_select_value.size() == 3) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 115800000);
    EXPECT_EQ(map_select_value[exp_dummy_asset_b.GetHex()], 19226350);
    EXPECT_EQ(map_select_value[exp_dummy_asset_c.GetHex()], 127030000);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 0);
  EXPECT_EQ(map_searched_bnb.size(), 3);
  if (map_searched_bnb.size() == 3) {
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
    EXPECT_TRUE(map_searched_bnb[exp_dummy_asset_b.GetHex()]);
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_c.GetHex()]);
  }
}